

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

bool Fossilize::shouldAttemptNonBlockingCreation<VkComputePipelineCreateInfo>
               (Device *layer,uint32_t createInfoCount,VkComputePipelineCreateInfo *pCreateInfos)

{
  bool bVar1;
  Instance *this;
  uint local_2c;
  uint32_t i;
  VkComputePipelineCreateInfo *pCreateInfos_local;
  uint32_t createInfoCount_local;
  Device *layer_local;
  
  this = Device::getInstance(layer);
  bVar1 = Instance::enablesPrecompileQA(this);
  if ((bVar1) && (createInfoCount != 0)) {
    for (local_2c = 0; local_2c < createInfoCount; local_2c = local_2c + 1) {
      bVar1 = pipelineCreationIsNonBlocking<VkComputePipelineCreateInfo>(pCreateInfos + local_2c);
      if (bVar1) {
        return false;
      }
    }
    layer_local._7_1_ = true;
  }
  else {
    layer_local._7_1_ = false;
  }
  return layer_local._7_1_;
}

Assistant:

static bool shouldAttemptNonBlockingCreation(Device *layer, uint32_t createInfoCount, const T *pCreateInfos)
{
	if (layer->getInstance()->enablesPrecompileQA() && createInfoCount)
	{
		// If app is already trying non-blocking compile, the app will handle fallback case.
		for (uint32_t i = 0; i < createInfoCount; i++)
			if (pipelineCreationIsNonBlocking(pCreateInfos[i]))
				return false;

		return true;
	}
	else
	{
		return false;
	}
}